

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __last;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __last_00;
  bool bVar1;
  Type TVar2;
  Type type_00;
  Type type_01;
  initializer_list<wasm::Type> __l;
  undefined1 auVar3 [16];
  Type local_50;
  undefined1 local_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> nullable;
  Type type_local;
  
  nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (this < (void *)0x7 || ((ulong)this & 1) != 0) {
    __l._M_len = 1;
    __l._M_array = (iterator)local_48;
    local_48 = (undefined1  [8])this;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&local_50);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               &nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (((ulong)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 3) == 0 &&
        (pointer)&DAT_00000006 <
        nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      TVar2 = Type::with((Type *)&nullable.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,Nullable);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,(void *)TVar2.id,type_00);
      __last._M_current._1_7_ =
           nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_;
      __last._M_current._0_1_ =
           nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )local_48,__last);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
    }
    bVar1 = Type::isExact((Type *)&nullable.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      TVar2 = Type::with((Type *)&nullable.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,Inexact);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,(void *)TVar2.id,type_01);
      __last_00._M_current._1_7_ =
           nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_;
      __last_00._M_current._0_1_ =
           nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )local_48,__last_00);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
    }
    else {
      local_50.id = (uintptr_t)
                    Type::getHeapType((Type *)&nullable.
                                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      auVar3 = ::wasm::HeapType::getSuperType();
      nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = auVar3[8];
      while (local_48 = auVar3._0_8_, (auVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_50 = Type::with((Type *)&nullable.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (HeapType)local_48);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  (__return_storage_ptr__,&local_50);
        auVar3 = ::wasm::HeapType::getSuperType();
        nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = auVar3[8];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }